

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O2

void __thiscall Calculator::setPrintNumBase(Calculator *this,int base)

{
  ostream *poVar1;
  
  if (base - 2U < 0x23) {
    this->mPrintNumBase = base;
  }
  else {
    poVar1 = std::operator<<(this->mOutputStream,"The base must be >= 2 and <= 36.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Calculator::setPrintNumBase(int base) {
	try {
		if (base >= 2 && base <= 36) {
			mPrintNumBase = base;
		} else {
			mOutputStream << "The base must be >= 2 and <= 36." << std::endl;
		}
	} catch (std::exception& e) {
		mOutputStream << "The base must be an integer." << std::endl;
	}
}